

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  byte bVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  Frame *pFVar5;
  long lVar6;
  ulong uVar7;
  longlong lVar8;
  Frame *pFVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  IMkvReader *pReader;
  ulong uVar13;
  byte bVar14;
  Frame *curr;
  Frame *pFVar15;
  uchar val;
  uchar biased_count;
  Frame *local_68;
  Frame *local_60;
  ulong local_58;
  long len;
  IMkvReader *local_48;
  ulong local_40;
  longlong value;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar12 = this->m_start;
  if (lVar12 < 0) {
    __assert_fail("m_start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dec,"long mkvparser::Block::Parse(const Cluster *)");
  }
  lVar11 = this->m_size;
  if (lVar11 < 0) {
    __assert_fail("m_size >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1ded,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_track) {
    __assert_fail("m_track <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1dee,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (this->m_frames != (Frame *)0x0) {
    __assert_fail("m_frames == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1def,"long mkvparser::Block::Parse(const Cluster *)");
  }
  if (0 < this->m_frame_count) {
    __assert_fail("m_frame_count <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1df0,"long mkvparser::Block::Parse(const Cluster *)");
  }
  pReader = pCluster->m_pSegment->m_pReader;
  lVar3 = ReadUInt(pReader,lVar12,&len);
  local_60 = (Frame *)len;
  this->m_track = lVar3;
  if (0 < lVar3) {
    if (lVar11 - len < 2 || lVar11 < len) {
      return -2;
    }
    lVar10 = lVar12 + len;
    lVar4 = UnserializeInt(pReader,lVar10,2,&value);
    if (lVar4 != 0) {
      return -2;
    }
    if ((short)value != value) {
      return -2;
    }
    lVar12 = lVar12 + lVar11;
    this->m_timecode = (short)value;
    if (lVar12 <= lVar10 + 2) {
      return -2;
    }
    local_48 = pReader;
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar10 + 2,1,&this->m_flags);
    if (iVar2 != 0) {
      return -2;
    }
    bVar1 = this->m_flags >> 1;
    lVar4 = lVar10 + 3;
    bVar14 = bVar1 & 3;
    if ((bVar1 & 3) == 0) {
      this->m_frame_count = 1;
      pFVar5 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
      this->m_frames = pFVar5;
      if (pFVar5 == (Frame *)0x0) {
        return -1;
      }
      pFVar5->pos = lVar4;
      if (lVar12 - lVar4 != 0 && lVar4 <= lVar12) {
        pFVar5->len = lVar12 - lVar4;
        return 0;
      }
      return -2;
    }
    if (lVar12 <= lVar4) {
      return -2;
    }
    iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar4,1,&biased_count);
    if (iVar2 != 0) {
      return -2;
    }
    iVar2 = biased_count + 1;
    this->m_frame_count = iVar2;
    local_58 = CONCAT44(local_58._4_4_,iVar2);
    local_40 = (ulong)(uint)(iVar2 * 0x10);
    local_68 = (Frame *)operator_new__(local_40,(nothrow_t *)&std::nothrow);
    this->m_frames = local_68;
    if (local_68 == (Frame *)0x0) {
      return -1;
    }
    lVar10 = lVar10 + 4;
    if (bVar14 == 2) {
      lVar4 = lVar12 - lVar10;
      if ((lVar4 != 0 && lVar10 <= lVar12) &&
         (lVar6 = lVar4 / (long)(local_58 & 0xffffffff), lVar4 % (long)(local_58 & 0xffffffff) == 0)
         ) {
        if (lVar6 < 1) {
          return -2;
        }
        lVar4 = ((long)local_60 - lVar11) + 4;
        pFVar5 = local_68;
        for (lVar11 = (ulong)biased_count * 0x10 + 0x10; lVar11 != 0; lVar11 = lVar11 + -0x10) {
          if (lVar12 < lVar10 + lVar6) {
            __assert_fail("(pos + frame_size) <= stop",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1eb8,"long mkvparser::Block::Parse(const Cluster *)");
          }
          pFVar5->pos = lVar10;
          pFVar5->len = lVar6;
          pFVar5 = pFVar5 + 1;
          lVar4 = lVar4 + lVar6;
          lVar10 = lVar10 + lVar6;
        }
        if (lVar4 == 0) {
          return 0;
        }
        __assert_fail("pos == stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1ec4,"long mkvparser::Block::Parse(const Cluster *)");
      }
    }
    else if (bVar14 == 1) {
      pFVar5 = (Frame *)((long)&local_68->pos + local_40);
      local_60 = (Frame *)0x0;
      while (1 < (int)local_58) {
        lVar11 = 0;
        do {
          if (lVar12 <= lVar10) {
            return -2;
          }
          iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar10,1,&val);
          if (iVar2 != 0) {
            return -2;
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + (ulong)val;
        } while ((ulong)val == 0xff);
        if (pFVar5 <= local_68 + 1) {
          __assert_fail("pf < pf_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1e6f,"long mkvparser::Block::Parse(const Cluster *)");
        }
        local_68->pos = 0;
        if (lVar11 == 0) {
          return -2;
        }
        local_68->len = lVar11;
        local_60 = (Frame *)((long)local_60 + lVar11);
        pReader = local_48;
        local_68 = local_68 + 1;
        local_58 = CONCAT44(local_58._4_4_,(int)local_58 + -1);
      }
      lVar11 = lVar12 - lVar10;
      if (local_68 + 1 == pFVar5 && (lVar10 <= lVar12 && local_68 < pFVar5)) {
        local_68->pos = 0;
        if ((long)local_60 <= lVar11) {
          if (lVar11 - (long)local_60 == 0 || lVar11 < (long)local_60) {
            return -2;
          }
          local_68->len = lVar11 - (long)local_60;
          for (pFVar9 = this->m_frames; pFVar9 != pFVar5; pFVar9 = pFVar9 + 1) {
            lVar11 = pFVar9->len + lVar10;
            if (lVar12 < lVar11) {
              __assert_fail("(pos + f.len) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1e99,"long mkvparser::Block::Parse(const Cluster *)");
            }
            pFVar9->pos = lVar10;
            lVar10 = lVar11;
          }
          if (lVar10 == lVar12) {
            return 0;
          }
          __assert_fail("pos == stop",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ea2,"long mkvparser::Block::Parse(const Cluster *)");
        }
      }
    }
    else if (((lVar10 < lVar12) &&
             (local_68 = (Frame *)(ulong)biased_count, uVar7 = ReadUInt(pReader,lVar10,&len),
             0 < (long)uVar7)) &&
            (lVar3 = lVar10 + len, (long)(lVar3 + uVar7) <= lVar12 && lVar3 <= lVar12)) {
      pFVar5 = this->m_frames;
      iVar2 = this->m_frame_count;
      local_60 = pFVar5 + iVar2;
      pFVar5->pos = 0;
      pFVar5->len = uVar7;
      local_58 = (long)iVar2 * 0x10 + -0x20;
      pFVar9 = local_68;
      uVar13 = uVar7;
      while( true ) {
        pFVar15 = pFVar5 + 1;
        if ((uint)pFVar9 < 2) {
          if ((int)local_68 != 0) {
            lVar11 = lVar12 - lVar3;
            if (lVar12 < lVar3) {
              return -2;
            }
            if (local_60 <= pFVar5) {
              return -2;
            }
            if (pFVar5->len != uVar7) {
              __assert_fail("prev.len == frame_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x1f30,"long mkvparser::Block::Parse(const Cluster *)");
            }
            if (local_60 <= pFVar15) {
              return -2;
            }
            if (local_58 != 0) {
              return -2;
            }
            pFVar15->pos = 0;
            if (lVar11 < (long)uVar13) {
              return -2;
            }
            if (lVar11 - uVar13 == 0 || lVar11 < (long)uVar13) {
              return -2;
            }
            pFVar5[1].len = lVar11 - uVar13;
          }
          for (pFVar5 = this->m_frames; pFVar5 != local_60; pFVar5 = pFVar5 + 1) {
            lVar11 = pFVar5->len + lVar3;
            if (lVar12 < lVar11) {
              return -2;
            }
            pFVar5->pos = lVar3;
            lVar3 = lVar11;
          }
          if (lVar3 == lVar12) {
            return 0;
          }
          return -2;
        }
        if (lVar12 <= lVar3) {
          return -2;
        }
        if (local_60 <= pFVar5) {
          __assert_fail("pf < pf_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1ef5,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (pFVar5->len != uVar7) {
          __assert_fail("prev.len == frame_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1efa,"long mkvparser::Block::Parse(const Cluster *)");
        }
        if (local_60 <= pFVar15) break;
        pFVar15->pos = 0;
        lVar8 = ReadUInt(local_48,lVar3,&len);
        if (lVar8 < 0) {
          return -2;
        }
        lVar3 = lVar3 + len;
        if (lVar12 < lVar3) {
          return -2;
        }
        uVar7 = uVar7 + lVar8 + (-1L << ((char)len * '\a' - 1U & 0x3f)) + 1;
        if ((long)uVar7 < 1) {
          return -2;
        }
        pFVar5[1].len = uVar7;
        if ((long)(uVar7 ^ 0x7fffffffffffffff) < (long)uVar13) {
          return -2;
        }
        uVar13 = uVar13 + uVar7;
        pFVar9 = (Frame *)(ulong)((uint)pFVar9 - 1);
        local_58 = local_58 + -0x10;
        pFVar5 = pFVar15;
      }
      __assert_fail("pf < pf_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1efe,"long mkvparser::Block::Parse(const Cluster *)");
    }
    return -2;
  }
  return -2;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;
#endif

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

#if LLONG_MAX > LONG_MAX
      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;
#endif

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}